

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

int Cof_NodeDeref_rec(Cof_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = 0;
  while ((uVar1 = *(uint *)pNode, (uVar1 & 0xf0) != 0 &&
         (uVar3 = (uVar1 >> 8) - 1, *(uint *)pNode = uVar1 & 0xff | uVar3 * 0x100,
         (uVar3 & 0xffffff) == 0))) {
    iVar2 = Cof_NodeDeref_rec((Cof_Obj_t *)
                              ((long)pNode + ((ulong)*(uint *)(pNode + 1) & 0x7fffffff) * -4));
    pNode = (Cof_Obj_t *)((long)pNode + ((ulong)pNode[1].nFanoutsM & 0x7fffffff) * -4);
    iVar4 = iVar4 + iVar2 + 1;
  }
  return iVar4;
}

Assistant:

int Cof_NodeDeref_rec( Cof_Obj_t * pNode )
{
    if ( pNode->nFanins == 0 )
        return 0;
    if ( --pNode->nFanouts > 0 )
        return 0;
    return 1 + Cof_NodeDeref_rec( Cof_ObjFanin(pNode, 0) )
             + Cof_NodeDeref_rec( Cof_ObjFanin(pNode, 1) );
}